

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
checkInterfacePropertyCompatibility<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_6)

{
  pointer tgt_00;
  CompatibleType CVar1;
  bool bVar2;
  bool bVar3;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *this;
  string *psVar4;
  cmLocalGenerator *localGenerator;
  reference ppcVar5;
  iterator __first;
  iterator __last;
  pointer genexInterpreter_00;
  ostream *poVar6;
  pointer local_938;
  byte local_8eb;
  byte local_8ea;
  string local_8c8;
  string local_8a8;
  string local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  string local_848;
  undefined1 local_828 [8];
  ostringstream e_2;
  string local_6b0;
  undefined1 local_690 [8];
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent_2;
  undefined1 local_648 [8];
  ostringstream e_1;
  string local_4d0;
  undefined1 local_4b0 [8];
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent_1;
  string local_468;
  string local_448;
  undefined1 local_428 [8];
  ostringstream e;
  string local_2b0;
  undefined1 local_290 [8];
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent;
  string local_248;
  undefined1 local_228 [8];
  string reportEntry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ifacePropContent;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  byte local_1c1;
  undefined1 local_1c0 [7];
  bool ifaceIsSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  cmGeneratorTarget *theTarget;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range1;
  string local_180;
  byte local_159;
  string local_158;
  undefined1 local_131;
  cmGeneratorExpressionInterpreter *local_130;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  local_128;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  string interfaceProperty;
  string local_e0;
  allocator<char> local_b9;
  undefined1 local_b8 [8];
  string report;
  bool propInitialized;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *deps;
  iterator iStack_80;
  bool impliedByUse;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  byte local_5d;
  bool explicitlySet;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  CompatibleType t_local;
  char *defaultValue_local;
  string *config_local;
  string *p_local;
  cmGeneratorTarget *tgt_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *propContent;
  
  headPropKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  headPropKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = t;
  getTypedProperty<std::__cxx11::string>
            (__return_storage_ptr__,tgt,p,(cmGeneratorExpressionInterpreter *)0x0);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50,tgt);
  local_70._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50);
  local_68 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_70,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_78,p);
  iStack_80 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_50);
  local_5d = __gnu_cxx::operator!=(&local_68,&stack0xffffffffffffff80);
  bVar2 = cmGeneratorTarget::IsNullImpliedByLinkLibraries(tgt,p);
  local_8ea = 1;
  if (bVar2 == (bool)(local_5d & 1)) {
    local_8eb = 0;
    if (!bVar2) {
      local_8eb = local_5d ^ 0xff;
    }
    local_8ea = local_8eb;
  }
  if ((local_8ea & 1) == 0) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x11f0,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = std::basic_string<char>]"
                 );
  }
  this = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  bVar3 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::empty
                    (this);
  if (bVar3) {
    headPropKeys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    report.field_2._12_4_ = 1;
  }
  else {
    report.field_2._M_local_buf[0xb] = local_5d & 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_b8," * Target \"",&local_b9);
    std::allocator<char>::~allocator(&local_b9);
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    std::__cxx11::string::operator+=((string *)local_b8,(string *)psVar4);
    if ((local_5d & 1) == 0) {
      if (bVar2) {
        std::__cxx11::string::operator+=((string *)local_b8,"\" property is implied by use.\n");
      }
      else {
        std::__cxx11::string::operator+=((string *)local_b8,"\" property not set.\n");
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)local_b8,"\" has property content \"");
      std::__cxx11::string::string
                ((string *)(interfaceProperty.field_2._M_local_buf + 8),
                 (string *)__return_storage_ptr__);
      valueAsString<std::__cxx11::string>
                (&local_e0,(string *)((long)&interfaceProperty.field_2 + 8));
      std::__cxx11::string::operator+=((string *)local_b8,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_b8,"\"\n");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &genexInterpreter,"INTERFACE_",p);
    bVar3 = std::operator==(p,"POSITION_INDEPENDENT_CODE");
    local_131 = 0;
    local_159 = 0;
    if (bVar3) {
      local_938 = (pointer)operator_new(0x68);
      local_131 = 1;
      local_130 = local_938;
      localGenerator = cmGeneratorTarget::GetLocalGenerator(tgt);
      std::__cxx11::string::string((string *)&local_158,(string *)config);
      local_159 = 1;
      std::__cxx11::string::string((string *)&local_180);
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                (local_938,localGenerator,&local_158,tgt,&local_180);
    }
    else {
      local_938 = (pointer)0x0;
    }
    local_131 = 0;
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,std::default_delete<cmGeneratorExpressionInterpreter>>
    ::unique_ptr<std::default_delete<cmGeneratorExpressionInterpreter>,void>
              ((unique_ptr<cmGeneratorExpressionInterpreter,std::default_delete<cmGeneratorExpressionInterpreter>>
                *)&local_128,local_938);
    if (bVar3) {
      std::__cxx11::string::~string((string *)&local_180);
    }
    if ((local_159 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_158);
    }
    __end1 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
             begin(this);
    theTarget = (cmGeneratorTarget *)
                std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                end(this);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                       *)&theTarget), bVar3) {
      ppcVar5 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&__end1);
      propKeys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar5;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c0,
                 (cmGeneratorTarget *)
                 propKeys.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1c0);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1c0);
      local_1d0 = std::
                  find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                            (__first._M_current,__last._M_current,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &genexInterpreter);
      ifacePropContent.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c0);
      local_1c1 = __gnu_cxx::operator!=
                            (&local_1d0,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&ifacePropContent.field_2 + 8));
      tgt_00 = propKeys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      genexInterpreter_00 =
           std::
           unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
           ::get(&local_128);
      getTypedProperty<std::__cxx11::string>
                ((string *)((long)&reportEntry.field_2 + 8),(cmGeneratorTarget *)tgt_00,
                 (string *)&genexInterpreter,genexInterpreter_00);
      std::__cxx11::string::string((string *)local_228);
      if ((local_1c1 & 1) != 0) {
        std::__cxx11::string::operator+=((string *)local_228," * Target \"");
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((cmGeneratorTarget *)
                            propKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=((string *)local_228,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)local_228,"\" property value \"");
        std::__cxx11::string::string
                  ((string *)(consistent.second.field_2._M_local_buf + 8),
                   (string *)(reportEntry.field_2._M_local_buf + 8));
        valueAsString<std::__cxx11::string>
                  (&local_248,(string *)((long)&consistent.second.field_2 + 8));
        std::__cxx11::string::operator+=((string *)local_228,(string *)&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)(consistent.second.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_228,"\" ");
      }
      if ((local_5d & 1) == 0) {
        if (bVar2) {
          std::__cxx11::string::string
                    ((string *)(consistent_1.second.field_2._M_local_buf + 8),
                     (string *)__return_storage_ptr__);
          impliedValue<std::__cxx11::string>
                    (&local_468,(string *)((long)&consistent_1.second.field_2 + 8));
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_468);
          std::__cxx11::string::~string((string *)&local_468);
          std::__cxx11::string::~string((string *)(consistent_1.second.field_2._M_local_buf + 8));
          if ((local_1c1 & 1) == 0) {
            report.field_2._12_4_ = 3;
          }
          else {
            consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_4b0,__return_storage_ptr__,
                               (string *)((long)&reportEntry.field_2 + 8),
                               headPropKeys.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            std::__cxx11::string::operator+=((string *)local_b8,(string *)local_228);
            CVar1 = headPropKeys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            bVar3 = std::operator!=(__return_storage_ptr__,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&consistent_1);
            compatibilityAgree_abi_cxx11_(&local_4d0,CVar1,bVar3);
            std::__cxx11::string::operator+=((string *)local_b8,(string *)&local_4d0);
            std::__cxx11::string::~string((string *)&local_4d0);
            if ((local_4b0[0] & 1U) == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_648);
              poVar6 = std::operator<<((ostream *)local_648,"Property ");
              poVar6 = std::operator<<(poVar6,(string *)p);
              poVar6 = std::operator<<(poVar6," on target \"");
              psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
              poVar6 = std::operator<<(poVar6,(string *)psVar4);
              poVar6 = std::operator<<(poVar6,"\" is\nimplied to be ");
              poVar6 = std::operator<<(poVar6,defaultValue);
              poVar6 = std::operator<<(poVar6,
                                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                      );
              poVar6 = std::operator<<(poVar6,(string *)p);
              poVar6 = std::operator<<(poVar6," property on\ndependency \"");
              psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                                 ((cmGeneratorTarget *)
                                  propKeys.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              poVar6 = std::operator<<(poVar6,(string *)psVar4);
              std::operator<<(poVar6,"\" is in conflict.\n");
              std::__cxx11::ostringstream::str();
              cmSystemTools::Error((string *)((long)&consistent_2.second.field_2 + 8));
              std::__cxx11::string::~string
                        ((string *)(consistent_2.second.field_2._M_local_buf + 8));
              report.field_2._12_4_ = 2;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_648);
            }
            else {
              std::__cxx11::string::operator=
                        ((string *)__return_storage_ptr__,(string *)&consistent_1);
              report.field_2._12_4_ = 3;
            }
            std::
            pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_4b0);
          }
        }
        else if ((local_1c1 & 1) == 0) {
          report.field_2._12_4_ = 3;
        }
        else if ((report.field_2._M_local_buf[0xb] & 1U) == 0) {
          std::operator+(&local_868,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_228,"(Interface set)\n");
          std::__cxx11::string::operator+=((string *)local_b8,(string *)&local_868);
          std::__cxx11::string::~string((string *)&local_868);
          std::__cxx11::string::operator=
                    ((string *)__return_storage_ptr__,
                     (string *)(reportEntry.field_2._M_local_buf + 8));
          report.field_2._M_local_buf[0xb] = '\x01';
          report.field_2._12_4_ = 0;
        }
        else {
          consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_690,__return_storage_ptr__,
                             (string *)((long)&reportEntry.field_2 + 8),
                             headPropKeys.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          std::__cxx11::string::operator+=((string *)local_b8,(string *)local_228);
          CVar1 = headPropKeys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          bVar3 = std::operator!=(__return_storage_ptr__,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&consistent_2);
          compatibilityAgree_abi_cxx11_(&local_6b0,CVar1,bVar3);
          std::__cxx11::string::operator+=((string *)local_b8,(string *)&local_6b0);
          std::__cxx11::string::~string((string *)&local_6b0);
          if ((local_690[0] & 1U) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_828);
            poVar6 = std::operator<<((ostream *)local_828,"The INTERFACE_");
            poVar6 = std::operator<<(poVar6,(string *)p);
            poVar6 = std::operator<<(poVar6," property of \"");
            psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                               ((cmGeneratorTarget *)
                                propKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            poVar6 = std::operator<<(poVar6,(string *)psVar4);
            poVar6 = std::operator<<(poVar6,"\" does\nnot agree with the value of ");
            poVar6 = std::operator<<(poVar6,(string *)p);
            poVar6 = std::operator<<(poVar6," already determined\nfor \"");
            psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar6 = std::operator<<(poVar6,(string *)psVar4);
            std::operator<<(poVar6,"\".\n");
            std::__cxx11::ostringstream::str();
            cmSystemTools::Error(&local_848);
            std::__cxx11::string::~string((string *)&local_848);
            report.field_2._12_4_ = 2;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_828);
          }
          else {
            std::__cxx11::string::operator=
                      ((string *)__return_storage_ptr__,(string *)&consistent_2);
            report.field_2._12_4_ = 3;
          }
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_690);
        }
      }
      else if ((local_1c1 & 1) == 0) {
        report.field_2._12_4_ = 3;
      }
      else {
        consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_290,__return_storage_ptr__,
                           (string *)((long)&reportEntry.field_2 + 8),
                           headPropKeys.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        std::__cxx11::string::operator+=((string *)local_b8,(string *)local_228);
        CVar1 = headPropKeys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        bVar3 = std::operator!=(__return_storage_ptr__,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&consistent);
        compatibilityAgree_abi_cxx11_(&local_2b0,CVar1,bVar3);
        std::__cxx11::string::operator+=((string *)local_b8,(string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        if ((local_290[0] & 1U) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
          poVar6 = std::operator<<((ostream *)local_428,"Property ");
          poVar6 = std::operator<<(poVar6,(string *)p);
          poVar6 = std::operator<<(poVar6," on target \"");
          psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
          poVar6 = std::operator<<(poVar6,(string *)psVar4);
          poVar6 = std::operator<<(poVar6,"\" does\nnot match the INTERFACE_");
          poVar6 = std::operator<<(poVar6,(string *)p);
          poVar6 = std::operator<<(poVar6," property requirement\nof dependency \"");
          psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                             ((cmGeneratorTarget *)
                              propKeys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          poVar6 = std::operator<<(poVar6,(string *)psVar4);
          std::operator<<(poVar6,"\".\n");
          std::__cxx11::ostringstream::str();
          cmSystemTools::Error(&local_448);
          std::__cxx11::string::~string((string *)&local_448);
          report.field_2._12_4_ = 2;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
        }
        else {
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&consistent);
          report.field_2._12_4_ = 3;
        }
        std::
        pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_290);
      }
      std::__cxx11::string::~string((string *)local_228);
      std::__cxx11::string::~string((string *)(reportEntry.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1c0);
      if ((report.field_2._12_4_ != 0) && (report.field_2._12_4_ == 2)) break;
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::string::string((string *)&local_8a8,(string *)__return_storage_ptr__);
    valueAsString<std::__cxx11::string>(&local_888,&local_8a8);
    compatibilityType_abi_cxx11_
              (&local_8c8,
               headPropKeys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    cmGeneratorTarget::ReportPropertyOrigin(tgt,p,&local_888,(string *)local_b8,&local_8c8);
    std::__cxx11::string::~string((string *)&local_8c8);
    std::__cxx11::string::~string((string *)&local_888);
    std::__cxx11::string::~string((string *)&local_8a8);
    headPropKeys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    report.field_2._12_4_ = 1;
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
    ::~unique_ptr(&local_128);
    std::__cxx11::string::~string((string *)&genexInterpreter);
    std::__cxx11::string::~string((string *)local_b8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  if ((headPropKeys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}